

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

ArrowTypeExtension *
duckdb::GetArrowExtensionInternal
          (ArrowTypeExtension *__return_storage_ptr__,
          unordered_map<duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension,_duckdb::HashArrowTypeExtension,_std::equal_to<duckdb::ArrowExtensionMetadata>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>_>
          *type_extensions,ArrowExtensionMetadata *info)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  get_type_t p_Var2;
  iterator iVar3;
  mapped_type *pmVar4;
  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> type;
  string format;
  ArrowExtensionMetadata og_info;
  undefined1 local_f8 [16];
  string local_e8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char local_98 [16];
  char *local_88;
  char local_78 [16];
  char *local_68;
  char local_58 [16];
  char *local_48;
  long local_40;
  char local_38 [16];
  
  iVar3 = ::std::
          _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&type_extensions->_M_h,info);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
      ._M_cur == (__node_type *)0x0) {
    ArrowExtensionMetadata::ArrowExtensionMetadata((ArrowExtensionMetadata *)&local_a8,info);
    local_c8[0] = local_b8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,anon_var_dwarf_4f470fa + 9)
    ;
    ::std::__cxx11::string::operator=((string *)&info->arrow_format,(string *)local_c8);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
    iVar3 = ::std::
            _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&type_extensions->_M_h,info);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_48,local_48 + local_40);
      ArrowType::GetTypeFromFormat((ArrowType *)local_f8,&local_e8);
      local_f8._8_8_ = local_f8._0_8_;
      local_f8._0_8_ =
           (__uniq_ptr_impl<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)0x0;
      ArrowTypeExtension::ArrowTypeExtension
                (__return_storage_ptr__,(ArrowExtensionMetadata *)&local_a8,
                 (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> *)
                 (local_f8 + 8));
      ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::~unique_ptr
                ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)
                 (local_f8 + 8));
      ::std::unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>::~unique_ptr
                ((unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_> *)local_f8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    if ((char *)local_a8._M_allocated_capacity != local_98) {
      operator_delete((void *)local_a8._M_allocated_capacity);
    }
    if (iVar3.
        super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
        ._M_cur == (__node_type *)0x0) {
      return __return_storage_ptr__;
    }
  }
  pmVar4 = ::std::__detail::
           _Map_base<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)type_extensions,info);
  p_Var2 = pmVar4->get_type;
  __return_storage_ptr__->populate_arrow_schema = pmVar4->populate_arrow_schema;
  __return_storage_ptr__->get_type = p_Var2;
  ArrowExtensionMetadata::ArrowExtensionMetadata
            (&__return_storage_ptr__->extension_metadata,&pmVar4->extension_metadata);
  (__return_storage_ptr__->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pmVar4->type_extension).internal.
       super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (pmVar4->type_extension).internal.
           super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (__return_storage_ptr__->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ArrowTypeExtension GetArrowExtensionInternal(
    unordered_map<ArrowExtensionMetadata, ArrowTypeExtension, HashArrowTypeExtension> &type_extensions,
    ArrowExtensionMetadata info) {
	if (type_extensions.find(info) == type_extensions.end()) {
		auto og_info = info;
		info.SetArrowFormat("");
		if (type_extensions.find(info) == type_extensions.end()) {
			auto format = og_info.GetArrowFormat();
			auto type = ArrowType::GetTypeFromFormat(format);
			return ArrowTypeExtension(og_info, std::move(type));
		}
	}
	return type_extensions[info];
}